

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucln_cmn.cpp
# Opt level: O1

void u_cleanup_63(void)

{
  umtx_lock_63((UMutex *)0x0);
  umtx_unlock_63((UMutex *)0x0);
  ucln_lib_cleanup_63();
  cmemory_cleanup_63();
  utrace_cleanup_63();
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_cleanup(void)
{
    UTRACE_ENTRY_OC(UTRACE_U_CLEANUP);
    umtx_lock(NULL);     /* Force a memory barrier, so that we are sure to see   */
    umtx_unlock(NULL);   /*   all state left around by any other threads.        */

    ucln_lib_cleanup();

    cmemory_cleanup();       /* undo any heap functions set by u_setMemoryFunctions(). */
    UTRACE_EXIT();           /* Must be before utrace_cleanup(), which turns off tracing. */
/*#if U_ENABLE_TRACING*/
    utrace_cleanup();
/*#endif*/
}